

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

Parser * __thiscall
flatbuffers::FlatCompiler::GetConformParser
          (Parser *__return_storage_ptr__,FlatCompiler *this,FlatCOptions *options)

{
  string *__rhs;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  string contents;
  
  IDLOptions::IDLOptions((IDLOptions *)&contents);
  Parser::Parser(__return_storage_ptr__,(IDLOptions *)&contents);
  IDLOptions::~IDLOptions((IDLOptions *)&contents);
  (__return_storage_ptr__->opts).lang_to_generate = (options->opts).lang_to_generate;
  if ((options->conform_to_schema)._M_string_length != 0) {
    contents._M_dataplus._M_p = (pointer)&contents.field_2;
    contents._M_string_length = 0;
    __rhs = &options->conform_to_schema;
    contents.field_2._M_local_buf[0] = '\0';
    bVar1 = LoadFile((__rhs->_M_dataplus)._M_p,true,&contents);
    if (!bVar1) {
      std::operator+(&local_360,"unable to load schema: ",__rhs);
      (*(this->params_).error_fn)(this,&local_360,true,true);
      std::__cxx11::string::~string((string *)&local_360);
    }
    GetExtension(&local_360,__rhs);
    bVar1 = std::operator==(&local_360,"bfbs");
    std::__cxx11::string::~string((string *)&local_360);
    if (bVar1) {
      LoadBinarySchema(this,__return_storage_ptr__,__rhs,&contents);
    }
    else {
      ParseFile(this,__return_storage_ptr__,__rhs,&contents,&options->conform_include_directories);
    }
    std::__cxx11::string::~string((string *)&contents);
  }
  return __return_storage_ptr__;
}

Assistant:

flatbuffers::Parser FlatCompiler::GetConformParser(
    const FlatCOptions &options) {
  flatbuffers::Parser conform_parser;

  // conform parser should check advanced options,
  // so, it have to have knowledge about languages:
  conform_parser.opts.lang_to_generate = options.opts.lang_to_generate;

  if (!options.conform_to_schema.empty()) {
    std::string contents;
    if (!flatbuffers::LoadFile(options.conform_to_schema.c_str(), true,
                               &contents)) {
      Error("unable to load schema: " + options.conform_to_schema);
    }

    if (flatbuffers::GetExtension(options.conform_to_schema) ==
        reflection::SchemaExtension()) {
      LoadBinarySchema(conform_parser, options.conform_to_schema, contents);
    } else {
      ParseFile(conform_parser, options.conform_to_schema, contents,
                options.conform_include_directories);
    }
  }
  return conform_parser;
}